

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O0

int mp3_next_frame(file_t *mp3,mp3_frame_t *frame)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint local_24;
  uint resync;
  mp3_frame_t *frame_local;
  file_t *mp3_local;
  
  if (mp3 == (file_t *)0x0) {
    __assert_fail("mp3 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x301,
                  "int mp3_next_frame(file_t *, mp3_frame_t *)");
  }
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x302,
                  "int mp3_next_frame(file_t *, mp3_frame_t *)");
  }
  local_24 = 0;
  do {
    while( true ) {
      if (local_24 == 0) {
        iVar2 = file_read(mp3,frame->raw,4);
        if (iVar2 < 1) {
          return -1;
        }
      }
      else {
        frame->raw[0] = frame->raw[1];
        frame->raw[1] = frame->raw[2];
        frame->raw[2] = frame->raw[3];
        iVar2 = file_read(mp3,frame->raw + 3,1);
        if (iVar2 < 1) {
          return -1;
        }
      }
      if ((frame->raw[0] != 0xff) || ((int)(uint)frame->raw[1] >> 5 != 7)) break;
      iVar2 = mp3_read_hdr(frame);
      if ((iVar2 == 0) || (local_24 = 0, 4000 < frame->frame_size)) goto LAB_00103722;
      iVar2 = file_read(mp3,frame->raw + 4,frame->frame_size - 4);
      if (iVar2 < 1) {
        return -1;
      }
      iVar2 = mp3_read_si(frame);
      if (iVar2 != 0) {
        return 1;
      }
    }
    if ((((frame->raw[0] == 'I') && (frame->raw[1] == 'D')) && (frame->raw[2] == '3')) &&
       (iVar2 = mp3_skip_id3v2(mp3,frame), iVar2 != 0)) {
      local_24 = 0;
    }
    else {
LAB_00103722:
      frame->syncskip = frame->syncskip + 1;
      uVar3 = local_24 + 1;
      bVar1 = 4000 < local_24;
      local_24 = uVar3;
      if (bVar1) {
        fprintf(_stderr,"Max sync exceeded: %d\n",(ulong)uVar3);
        return -2;
      }
    }
  } while( true );
}

Assistant:

int mp3_next_frame(file_t *mp3, mp3_frame_t *frame) {
  assert(mp3 != NULL);
  assert(frame != NULL);

  unsigned int resync = 0;
  again:
  if (resync != 0) {
    /* read the next byte and build the new header */
    frame->raw[0] = frame->raw[1];
    frame->raw[1] = frame->raw[2];
    frame->raw[2] = frame->raw[3];

    if (file_read(mp3, frame->raw + 3, 1) <= 0)
      return EEOF;
  } else {
    if (file_read(mp3, frame->raw, MP3_HDR_SIZE) <= 0)
      return EEOF;
  }

  if ((frame->raw[0] == 0xFF) &&
      (((unsigned char) (frame->raw[1] >> 5) & 0x7u) == 0x7)) {
    if (!mp3_read_hdr(frame))
      goto resync;
    else
      resync = 0;
  } else if ((frame->raw[0] == 'I') &&
             (frame->raw[1] == 'D') &&
             (frame->raw[2] == '3')) {
    if (!mp3_skip_id3v2(mp3, frame)) {
      goto resync;
    } else {
      resync = 0;
      goto again;
    }
  } else {
    goto resync;
  }

  if (frame->frame_size > MP3_RAW_SIZE)
    goto resync;

  if (file_read(mp3, frame->raw + 4, frame->frame_size - 4) <= 0)
    return EEOF;

  if (!mp3_read_si(frame))
    goto again;

  return 1;

  resync:
  frame->syncskip++;
  if (resync++ > MP3_MAX_SYNC) {
    fprintf(stderr, "Max sync exceeded: %d\n", resync);
    return ESYNC;
  } else
    goto again;
}